

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_tests.cpp
# Opt level: O0

void __thiscall omp_zip_iterator_types_Test::TestBody(omp_zip_iterator_types_Test *this)

{
  allocator<int> *this_00;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  const_iterator iterators;
  iterator iterators_1;
  char *message;
  char *in_R9;
  string local_130;
  AssertHelper local_110;
  Message local_108;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_;
  bool s_is_it;
  bool f_is_const_it;
  undefined1 local_d0 [8];
  zip_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  result;
  int local_b8 [8];
  iterator local_98;
  size_type local_90;
  undefined1 local_88 [8];
  vector<int,_std::allocator<int>_> initial2;
  allocator<int> local_59;
  int local_58 [8];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> initial1;
  omp_zip_iterator_types_Test *this_local;
  
  local_58[0] = 1;
  local_58[1] = 2;
  local_58[2] = 3;
  local_58[3] = 4;
  local_58[4] = 5;
  local_38 = local_58;
  local_30 = 5;
  initial1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<int>::allocator(&local_59);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l_00,&local_59);
  std::allocator<int>::~allocator(&local_59);
  local_b8[0] = 6;
  local_b8[1] = 7;
  local_b8[2] = 8;
  local_b8[3] = 9;
  local_b8[4] = 0;
  local_98 = local_b8;
  local_90 = 5;
  this_00 = (allocator<int> *)
            ((long)&result.iterators_.
                    super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                    .
                    super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
                    ._M_head_impl._M_current + 7);
  std::allocator<int>::allocator(this_00);
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_88,__l,this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&result.iterators_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
                     ._M_head_impl._M_current + 7));
  iterators = std::begin<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)local_28);
  iterators_1 = std::begin<std::vector<int,std::allocator<int>>>
                          ((vector<int,_std::allocator<int>_> *)local_88);
  omp::details::
  zip_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  ::zip_iterator((zip_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                  *)local_d0,
                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                 iterators._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 iterators_1._M_current);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_1_ = 1;
  local_f9 = true;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_130,(internal *)local_f8,(AssertionResult *)"f_is_const_it && s_is_it","false"
               ,"true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/zip_tests.cpp"
               ,0x3f,message);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_88);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST(omp_zip, iterator_types) {
  const std::vector initial1 = {1, 2, 3, 4, 5};
  std::vector initial2 = {6, 7, 8, 9, 0};

  auto result = omp::zip_iterator(std::begin(initial1), std::begin(initial2));

  auto f_is_const_it = std::is_same_v<
      decltype(initial1)::const_iterator,
      std::tuple_element_t<0, std::decay_t<decltype(result.iterators())>>>;

  auto s_is_it = std::is_same_v<
      decltype(initial2)::iterator,
      std::tuple_element_t<1, std::decay_t<decltype(result.iterators())>>>;

  ASSERT_TRUE(f_is_const_it && s_is_it);
}